

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O3

void __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
lte_operator::~lte_operator(lte_operator *this)

{
  operator_delete(this,0x18);
  return;
}

Assistant:

std::uintmax_t operator()(string_type const& s) const noexcept
                {
                    const int p = 31;
                    const int m = static_cast<int>(1e9) + 9;
                    std::uintmax_t hash_value = 0;
                    std::uintmax_t p_pow = 1;
                    for (char_type c : s) {
                        hash_value = (hash_value + (c - 'a' + 1) * p_pow) % m;
                        p_pow = (p_pow * p) % m;
                    }
                    return hash_value;   
                }